

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceMulExtended_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType xDataType,DataType yDataType,
          DataType msbDataType,DataType lsbDataType)

{
  undefined4 uVar1;
  bool bVar2;
  RenderContext *pRVar3;
  ostream *poVar4;
  ShaderType shaderType_00;
  char *local_320;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  undefined1 local_1a0 [8];
  ostringstream source;
  DataType yDataType_local;
  DataType xDataType_local;
  ShaderFunction function_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  source._368_4_ = xDataType;
  source._372_4_ = function;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pRVar3 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar2) {
    local_320 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_320 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,local_320);
  poVar4 = std::operator<<(poVar4,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1d8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
  poVar4 = std::operator<<(poVar4,"void main(void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    ");
  uVar1 = source._372_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"x",&local_219);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_1f8,uVar1,&local_218);
  poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
  poVar4 = std::operator<<(poVar4,"    ");
  uVar1 = source._368_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"y",&local_261);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_240,uVar1,&local_260);
  poVar4 = std::operator<<(poVar4,(string *)&local_240);
  poVar4 = std::operator<<(poVar4,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"msb",&local_2a9);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_288,yDataType,&local_2a8);
  poVar4 = std::operator<<(poVar4,(string *)&local_288);
  poVar4 = std::operator<<(poVar4,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"lsb",&local_2f1);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_2d0,msbDataType,&local_2f0);
  std::operator<<(poVar4,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (shaderType == SHADERTYPE_LAST) {
    std::operator<<((ostream *)local_1a0,"    umulExtended(x, y, msb, lsb);\n");
  }
  else if (shaderType == (SHADERTYPE_LAST|SHADERTYPE_FRAGMENT)) {
    std::operator<<((ostream *)local_1a0,"    imulExtended(x, y, msb, lsb);\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceMulExtended (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType xDataType, glu::DataType yDataType, glu::DataType msbDataType, glu::DataType lsbDataType)
{
	DE_ASSERT(function == SHADER_FUNCTION_UMUL_EXTENDED || function == SHADER_FUNCTION_IMUL_EXTENDED);

	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(xDataType, "x")
			<< "    " << declareAndInitializeShaderVariable(yDataType, "y")
			<< "    " << declareAndInitializeShaderVariable(msbDataType, "msb")
			<< "    " << declareAndInitializeShaderVariable(lsbDataType, "lsb");

	switch (function)
	{
		case SHADER_FUNCTION_UMUL_EXTENDED:	source << "    umulExtended(x, y, msb, lsb);\n";	break;
		case SHADER_FUNCTION_IMUL_EXTENDED:	source << "    imulExtended(x, y, msb, lsb);\n";	break;
		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}